

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,uint16_t *selected_algorithm,
                    ptls_buffer_t *outbuf,ptls_iovec_t input,uint16_t *algorithms,
                    size_t num_algorithms)

{
  EVP_PKEY *pkey;
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  EVP_MD_CTX *ctx;
  EVP_MD *pEVar4;
  ptls_sign_certificate_t *ppVar5;
  ptls_sign_certificate_t *ppVar6;
  size_t sVar7;
  size_t local_40;
  EVP_PKEY_CTX *local_38;
  
  uVar1 = *(uint16_t *)&_self[2].cb;
  if (uVar1 != 0xffff) {
    ppVar5 = _self;
    ppVar6 = _self + 2;
    do {
      if (num_algorithms != 0) {
        sVar7 = 0;
        do {
          if (algorithms[sVar7] == uVar1) {
            *selected_algorithm = uVar1;
            pkey = (EVP_PKEY *)_self[1].cb;
            pEVar4 = (EVP_MD *)ppVar5[3].cb;
            ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
            if (ctx == (EVP_MD_CTX *)0x0) {
              return 0x201;
            }
            iVar2 = EVP_DigestSignInit(ctx,&local_38,pEVar4,(ENGINE *)0x0,pkey);
            iVar3 = 0x203;
            if (iVar2 != 1) goto LAB_00106576;
            iVar2 = EVP_PKEY_get_id(pkey);
            if (iVar2 == 6) {
              iVar2 = EVP_PKEY_CTX_set_rsa_padding(local_38,6);
              if ((iVar2 != 1) ||
                 (iVar2 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_38,0xffffffff), iVar2 != 1))
              goto LAB_00106576;
              pEVar4 = EVP_sha256();
              iVar2 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_38,pEVar4);
              if (iVar2 != 1) goto LAB_00106576;
            }
            iVar2 = EVP_DigestSignUpdate(ctx,input.base,input.len);
            if ((iVar2 == 1) &&
               (iVar2 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&local_40), iVar2 == 1)) {
              msg("reserving %ld bytes",local_40);
              iVar3 = ptls_buffer_reserve(outbuf,local_40);
              if (iVar3 == 0) {
                iVar2 = EVP_DigestSignFinal(ctx,outbuf->base + outbuf->off,&local_40);
                iVar3 = 0x203;
                if (iVar2 == 1) {
                  outbuf->off = outbuf->off + local_40;
                  iVar3 = 0;
                }
              }
            }
LAB_00106576:
            EVP_MD_CTX_free(ctx);
            return iVar3;
          }
          sVar7 = sVar7 + 1;
        } while (num_algorithms != sVar7);
      }
      uVar1 = *(uint16_t *)&ppVar6[2].cb;
      ppVar5 = ppVar6;
      ppVar6 = ppVar6 + 2;
    } while (uVar1 != 0xffff);
  }
  return 0x28;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, outbuf, input, scheme->scheme_md);
}